

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyself.c
# Opt level: O2

void init_uasmon(void)

{
  ulong uVar1;
  undefined2 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  ulong uVar5;
  permonst *ppVar6;
  long lVar7;
  long lVar8;
  
  lVar7 = (long)u.umonster;
  upermonst.mname = mons[lVar7].mname;
  ppVar6 = mons + lVar7;
  upermonst.mlet = ppVar6->mlet;
  upermonst.mlevel = ppVar6->mlevel;
  upermonst.mmove = ppVar6->mmove;
  upermonst.ac = ppVar6->ac;
  upermonst.mr = ppVar6->mr;
  upermonst.maligntyp = ppVar6->maligntyp;
  upermonst.geno = ppVar6->geno;
  upermonst.mattk._0_8_ = *(undefined8 *)mons[lVar7].mattk;
  upermonst.mattk._8_8_ = *(undefined8 *)(mons[lVar7].mattk + 2);
  upermonst.mattk[4] = mons[lVar7].mattk[4];
  upermonst.mattk[5] = mons[lVar7].mattk[5];
  upermonst.cwt = mons[lVar7].cwt;
  upermonst.cnutrit = mons[lVar7].cnutrit;
  ppVar6 = mons + lVar7;
  upermonst.pxtyp = ppVar6->pxtyp;
  upermonst.msound = ppVar6->msound;
  upermonst.msize = ppVar6->msize;
  uVar5._0_4_ = mons[lVar7].mflags1;
  uVar5._4_4_ = mons[lVar7].mflags2;
  ppVar6 = mons + lVar7;
  uVar2 = ppVar6->mflags3;
  uVar3 = ppVar6->mresists;
  uVar4 = ppVar6->mconveys;
  upermonst.mconveys = uVar4;
  upermonst.mresists = uVar3;
  upermonst.mcolor = mons[lVar7].mcolor;
  upermonst._61_3_ = *(undefined3 *)&mons[lVar7].field_0x3d;
  lVar7 = (long)urace.malenum;
  uVar1._0_4_ = mons[lVar7].mflags1;
  uVar1._4_4_ = mons[lVar7].mflags2;
  upermonst._48_8_ = uVar1 | uVar5 & 0xbbfffff69ffdffff;
  upermonst.mflags3 = uVar2 & 0xfdff | mons[lVar7].mflags3;
  if (lVar7 == 0xe8) {
    for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
      upermonst.mattk[lVar8] = *(attack *)(lVar7 * 0x40 + 0x2ff940 + lVar8 * 4);
    }
  }
  set_uasmon();
  return;
}

Assistant:

void init_uasmon(void)
{
	int i;

	upermonst = mons[u.umonster];

	/* Fix up the flags */
	/* Default flags assume human, so replace with your race's flags. */

	upermonst.mflags1 &= ~(mons[PM_HUMAN].mflags1);
	upermonst.mflags1 |= (mons[urace.malenum].mflags1);

	upermonst.mflags2 &= ~(mons[PM_HUMAN].mflags2);
	upermonst.mflags2 |= (mons[urace.malenum].mflags2);

	upermonst.mflags3 &= ~(mons[PM_HUMAN].mflags3);
	upermonst.mflags3 |= (mons[urace.malenum].mflags3);

	/* Fix up the attacks for vampires */
	/* This replaces the role's attacks with the vampire's race attacks. */
	if (Race_if(PM_VAMPIRE)) {
	    for (i = 0; i < NATTK; i++) {
		upermonst.mattk[i] = mons[urace.malenum].mattk[i];
	    }
	}

	set_uasmon();
}